

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sundials_nvector.c
# Opt level: O3

int N_VConstVectorArray(int nvec,realtype c,N_Vector *Z)

{
  _func_int_int_realtype_N_Vector_ptr *UNRECOVERED_JUMPTABLE;
  int iVar1;
  ulong uVar2;
  
  UNRECOVERED_JUMPTABLE = (*Z)->ops->nvconstvectorarray;
  if (UNRECOVERED_JUMPTABLE != (_func_int_int_realtype_N_Vector_ptr *)0x0) {
    iVar1 = (*UNRECOVERED_JUMPTABLE)(nvec,c,Z);
    return iVar1;
  }
  if (0 < nvec) {
    uVar2 = 0;
    do {
      (*(*Z)->ops->nvconst)(c,Z[uVar2]);
      uVar2 = uVar2 + 1;
    } while ((uint)nvec != uVar2);
  }
  return 0;
}

Assistant:

int N_VConstVectorArray(int nvec, realtype c, N_Vector* Z)
{
  int i, ier;
  SUNDIALS_MARK_FUNCTION_BEGIN(getSUNProfiler(Z[0]));

  if (Z[0]->ops->nvconstvectorarray != NULL) {

    ier = Z[0]->ops->nvconstvectorarray(nvec, c, Z);

  } else {

    for (i=0; i<nvec; i++) {
      Z[0]->ops->nvconst(c, Z[i]);
    }
    ier = 0;

  }

  SUNDIALS_MARK_FUNCTION_BEGIN(getSUNProfiler(Z[0]));
  return(ier);
}